

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t * container_remove(container_t *c,uint16_t val,uint8_t typecode,uint8_t *new_typecode)

{
  _Bool _Var1;
  int iVar2;
  array_container_t *bitset;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  char in_DL;
  uint16_t in_SI;
  int card;
  undefined4 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffdc;
  uint16_t in_stack_ffffffffffffffde;
  array_container_t *arr;
  run_container_t *in_stack_fffffffffffffff8;
  
  arr = (array_container_t *)CONCAT71(in_register_00000009,in_CL);
  bitset = (array_container_t *)
           get_writable_copy_if_shared
                     ((container_t *)
                      CONCAT26(in_stack_ffffffffffffffde,
                               CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
                      (uint8_t *)0x13132b);
  if (in_DL == '\x01') {
    _Var1 = bitset_container_remove((bitset_container_t *)bitset,in_SI);
    if ((_Var1) &&
       (iVar2 = bitset_container_cardinality((bitset_container_t *)bitset), iVar2 < 0x1001)) {
      *(undefined1 *)&arr->cardinality = 2;
      bitset = array_container_from_bitset((bitset_container_t *)arr);
    }
    else {
      *(undefined1 *)&arr->cardinality = 1;
    }
  }
  else if (in_DL == '\x02') {
    *(undefined1 *)&arr->cardinality = 2;
    array_container_remove(arr,in_stack_ffffffffffffffde);
  }
  else {
    run_container_remove(in_stack_fffffffffffffff8,(uint16_t)((ulong)bitset >> 0x30));
    *(undefined1 *)&arr->cardinality = 3;
  }
  return bitset;
}

Assistant:

static inline container_t *container_remove(
    container_t *c, uint16_t val,
    uint8_t typecode,  // !!! should be second argument?
    uint8_t *new_typecode) {
    c = get_writable_copy_if_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            if (bitset_container_remove(CAST_bitset(c), val)) {
                int card = bitset_container_cardinality(CAST_bitset(c));
                if (card <= DEFAULT_MAX_SIZE) {
                    *new_typecode = ARRAY_CONTAINER_TYPE;
                    return array_container_from_bitset(CAST_bitset(c));
                }
            }
            *new_typecode = typecode;
            return c;
        case ARRAY_CONTAINER_TYPE:
            *new_typecode = typecode;
            array_container_remove(CAST_array(c), val);
            return c;
        case RUN_CONTAINER_TYPE:
            // per Java, no container type adjustments are done (revisit?)
            run_container_remove(CAST_run(c), val);
            *new_typecode = RUN_CONTAINER_TYPE;
            return c;
        default:
            assert(false);
            roaring_unreachable;
            return NULL;
    }
}